

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtoolbar.cpp
# Opt level: O0

bool __thiscall QToolBarPrivate::mousePressEvent(QToolBarPrivate *this,QMouseEvent *event)

{
  byte bVar1;
  bool bVar2;
  MouseButton MVar3;
  QPointF *this_00;
  QStyle *pQVar4;
  QSinglePointEvent *in_RSI;
  QToolBarPrivate *in_RDI;
  long in_FS_OFFSET;
  QToolBarPrivate *this_01;
  QPointF QVar5;
  QToolBar *q;
  QStyleOptionToolBar opt;
  undefined7 in_stack_ffffffffffffff28;
  undefined1 in_stack_ffffffffffffff2f;
  undefined4 in_stack_ffffffffffffff38;
  undefined4 in_stack_ffffffffffffff3c;
  undefined7 in_stack_ffffffffffffff58;
  undefined1 in_stack_ffffffffffffff5f;
  QPoint local_78;
  undefined1 local_70 [16];
  undefined1 local_60 [88];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = (QPointF *)q_func(in_RDI);
  memset(local_60,0xaa,0x58);
  QStyleOptionToolBar::QStyleOptionToolBar((QStyleOptionToolBar *)0x6eb868);
  (**(code **)(*(long *)&this_00->xp + 0x1a0))(this_00,local_60);
  pQVar4 = QWidget::style((QWidget *)CONCAT17(in_stack_ffffffffffffff2f,in_stack_ffffffffffffff28));
  local_70 = (**(code **)(*(long *)pQVar4 + 0xc0))(pQVar4,0x34,local_60,this_00);
  QSinglePointEvent::position((QSinglePointEvent *)0x6eb8b4);
  local_78 = QPointF::toPoint(this_00);
  bVar1 = QRect::contains((QPoint *)local_70,SUB81(&local_78,0));
  if ((bVar1 & 1) == 0) {
    bVar1 = 0;
  }
  else {
    MVar3 = QSinglePointEvent::button(in_RSI);
    if (MVar3 == LeftButton) {
      bVar2 = QToolBarLayout::movable
                        ((QToolBarLayout *)
                         CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38));
      if (bVar2) {
        QVar5 = QSinglePointEvent::position((QSinglePointEvent *)0x6eb948);
        this_01 = (QToolBarPrivate *)QVar5.xp;
        QPointF::toPoint(this_00);
        initDrag(this_01,(QPoint *)CONCAT17(in_stack_ffffffffffffff5f,in_stack_ffffffffffffff58));
        bVar1 = 1;
      }
      else {
        bVar1 = 1;
      }
    }
    else {
      bVar1 = 1;
    }
  }
  QStyleOptionToolBar::~QStyleOptionToolBar((QStyleOptionToolBar *)0x6eb989);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return (bool)(bVar1 & 1);
  }
  __stack_chk_fail();
}

Assistant:

bool QToolBarPrivate::mousePressEvent(QMouseEvent *event)
{
    Q_Q(QToolBar);
    QStyleOptionToolBar opt;
    q->initStyleOption(&opt);
    if (q->style()->subElementRect(QStyle::SE_ToolBarHandle, &opt, q).contains(event->position().toPoint()) == false) {
#ifdef Q_OS_MACOS
        // When using the unified toolbar on OS X, the user can click and
        // drag between toolbar contents to move the window. Make this work by
        // implementing the standard mouse-dragging code and then call
        // window->move() in mouseMoveEvent below.
        if (QMainWindow *mainWindow = qobject_cast<QMainWindow *>(parent)) {
            if (mainWindow->toolBarArea(q) == Qt::TopToolBarArea
                    && mainWindow->unifiedTitleAndToolBarOnMac()
                    && q->childAt(event->pos()) == 0) {
                macWindowDragging = true;
                macWindowDragPressPosition = event->pos();
                return true;
            }
        }
#endif
        return false;
    }

    if (event->button() != Qt::LeftButton)
        return true;

    if (!layout->movable())
        return true;

    initDrag(event->position().toPoint());
    return true;
}